

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lest_cpp03.hpp
# Opt level: O0

result * __thiscall
lest::expression_lhs<std::basic_string_view<char,std::char_traits<char>>const&>::operator==
          (result *__return_storage_ptr__,
          expression_lhs<std::basic_string_view<char,std::char_traits<char>>const&> *this,
          basic_string_view<char,_std::char_traits<char>_> *rhs)

{
  basic_string_view<char,_std::char_traits<char>_> *pbVar1;
  lest *this_00;
  basic_string_view<char,_std::char_traits<char>_> *in_R8;
  allocator<char> local_89;
  basic_string_view<char,_std::char_traits<char>_> local_88 [2];
  string local_68;
  size_t local_48;
  char *pcStack_40;
  size_t local_38;
  char *pcStack_30;
  bool local_21;
  string *local_20;
  basic_string_view<char,_std::char_traits<char>_> *rhs_local;
  expression_lhs<const_std::basic_string_view<char,_std::char_traits<char>_>_&> *this_local;
  
  pbVar1 = *(basic_string_view<char,_std::char_traits<char>_> **)this;
  local_38 = pbVar1->_M_len;
  pcStack_30 = pbVar1->_M_str;
  local_48 = rhs->_M_len;
  pcStack_40 = rhs->_M_str;
  local_20 = (string *)rhs;
  rhs_local = (basic_string_view<char,_std::char_traits<char>_> *)this;
  this_local = (expression_lhs<const_std::basic_string_view<char,_std::char_traits<char>_>_&> *)
               __return_storage_ptr__;
  local_21 = std::operator==(*pbVar1,*rhs);
  this_00 = *(lest **)this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)local_88,"==",&local_89);
  to_string<std::basic_string_view<char,std::char_traits<char>>,std::basic_string_view<char,std::char_traits<char>>>
            (&local_68,this_00,local_88,local_20,in_R8);
  result::result<bool>(__return_storage_ptr__,&local_21,&local_68);
  std::__cxx11::string::~string((string *)&local_68);
  std::__cxx11::string::~string((string *)local_88);
  std::allocator<char>::~allocator(&local_89);
  return __return_storage_ptr__;
}

Assistant:

result operator!=( R const & rhs ) { return result( lhs != rhs, to_string( lhs, "!=", rhs ) ); }